

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

void __thiscall icu_63::CollationDataBuilder::clearContexts(CollationDataBuilder *this)

{
  ushort uVar1;
  UBool UVar2;
  ushort uVar3;
  uint32_t ce32;
  ConditionalCE32 *pCVar4;
  UnicodeSetIterator iter;
  
  uVar1 = (this->contexts).fUnion.fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (this->contexts).fUnion.fStackFields.fLengthAndFlags = uVar3;
  UnicodeSetIterator::UnicodeSetIterator(&iter,&this->contextChars);
  while( true ) {
    UVar2 = UnicodeSetIterator::next(&iter);
    if (UVar2 == '\0') break;
    ce32 = utrie2_get32_63(this->trie,iter.codepoint);
    pCVar4 = getConditionalCE32ForCE32(this,ce32);
    pCVar4->builtCE32 = 1;
  }
  UnicodeSetIterator::~UnicodeSetIterator(&iter);
  return;
}

Assistant:

void
CollationDataBuilder::clearContexts() {
    contexts.remove();
    UnicodeSetIterator iter(contextChars);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        uint32_t ce32 = utrie2_get32(trie, iter.getCodepoint());
        U_ASSERT(isBuilderContextCE32(ce32));
        getConditionalCE32ForCE32(ce32)->builtCE32 = Collation::NO_CE32;
    }
}